

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndGroup(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  ImVec2 bb;
  ImVec2 size;
  ImVec2 nav_bb_arg;
  bool group_contains_curr_hovered_id;
  bool group_contains_prev_active_id;
  bool group_contains_curr_active_id;
  float in_stack_00000020;
  ImDrawFlags in_stack_00000024;
  float in_stack_00000028;
  ImU32 in_stack_0000002c;
  ImVec2 *in_stack_00000030;
  ImVec2 *in_stack_00000038;
  ImRect group_bb;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffff98;
  undefined5 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  ImVec2 *lhs;
  ImGuiItemFlags in_stack_ffffffffffffffb4;
  ImVec2 local_30;
  ImRect local_28;
  ImGuiGroupData *local_18;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = GImGui->CurrentWindow;
  local_18 = ImVector<ImGuiGroupData>::back(&GImGui->GroupStack);
  if (((local_10->DC).IsSetPos & 1U) != 0) {
    ErrorCheckUsingSetCursorPosToExtendParentBoundaries();
  }
  lhs = &local_18->BackupCursorPos;
  bb = ImMax(lhs,(ImVec2 *)
                 CONCAT17(in_stack_ffffffffffffffa7,
                          CONCAT16(in_stack_ffffffffffffffa6,
                                   CONCAT15(in_stack_ffffffffffffffa5,in_stack_ffffffffffffffa0))));
  local_30 = ImMax(lhs,(ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,
                                         CONCAT15(in_stack_ffffffffffffffa5,
                                                  in_stack_ffffffffffffffa0))));
  ImRect::ImRect(&local_28,lhs,&local_30);
  (local_10->DC).CursorPos = local_18->BackupCursorPos;
  (local_10->DC).CursorPosPrevLine = local_18->BackupCursorPosPrevLine;
  size = ImMax(lhs,(ImVec2 *)
                   CONCAT17(in_stack_ffffffffffffffa7,
                            CONCAT16(in_stack_ffffffffffffffa6,
                                     CONCAT15(in_stack_ffffffffffffffa5,in_stack_ffffffffffffffa0)))
              );
  (local_10->DC).CursorMaxPos = size;
  (local_10->DC).Indent.x = (local_18->BackupIndent).x;
  (local_10->DC).GroupOffset.x = (local_18->BackupGroupOffset).x;
  (local_10->DC).CurrLineSize = local_18->BackupCurrLineSize;
  (local_10->DC).CurrLineTextBaseOffset = local_18->BackupCurrLineTextBaseOffset;
  (local_10->DC).IsSameLine = (bool)(local_18->BackupIsSameLine & 1);
  if ((local_8->LogEnabled & 1U) != 0) {
    local_8->LogLinePosY = -3.4028235e+38;
  }
  if ((local_18->EmitItem & 1U) == 0) {
    ImVector<ImGuiGroupData>::pop_back(&local_8->GroupStack);
  }
  else {
    fVar4 = ImMax<float>((local_10->DC).PrevLineTextBaseOffset,
                         local_18->BackupCurrLineTextBaseOffset);
    (local_10->DC).CurrLineTextBaseOffset = fVar4;
    nav_bb_arg = ImRect::GetSize(in_stack_ffffffffffffff98);
    ItemSize((ImVec2 *)size,nav_bb_arg.y);
    ItemAdd((ImRect *)bb,(ImGuiID)size.y,(ImRect *)nav_bb_arg,in_stack_ffffffffffffffb4);
    bVar1 = false;
    if ((local_18->BackupActiveIdIsAlive != local_8->ActiveId) &&
       (bVar1 = false, local_8->ActiveIdIsAlive == local_8->ActiveId)) {
      bVar1 = local_8->ActiveId != 0;
    }
    bVar2 = false;
    if ((local_18->BackupActiveIdPreviousFrameIsAlive & 1U) == 0) {
      bVar2 = (local_8->ActiveIdPreviousFrameIsAlive & 1U) == 1;
    }
    if (bVar1) {
      (local_8->LastItemData).ID = local_8->ActiveId;
    }
    else if (bVar2) {
      (local_8->LastItemData).ID = local_8->ActiveIdPreviousFrame;
    }
    (local_8->LastItemData).Rect.Min = local_28.Min;
    (local_8->LastItemData).Rect.Max = local_28.Max;
    bVar3 = false;
    if ((local_18->BackupHoveredIdIsAlive & 1U) == 0) {
      bVar3 = local_8->HoveredId != 0;
    }
    if (bVar3) {
      (local_8->LastItemData).StatusFlags = (local_8->LastItemData).StatusFlags | 0x80;
    }
    if ((bVar1) && ((local_8->ActiveIdHasBeenEditedThisFrame & 1U) != 0)) {
      (local_8->LastItemData).StatusFlags = (local_8->LastItemData).StatusFlags | 4;
    }
    (local_8->LastItemData).StatusFlags = (local_8->LastItemData).StatusFlags | 0x20;
    if ((bVar2) && (local_8->ActiveId != local_8->ActiveIdPreviousFrame)) {
      (local_8->LastItemData).StatusFlags = (local_8->LastItemData).StatusFlags | 0x40;
    }
    ImVector<ImGuiGroupData>::pop_back(&local_8->GroupStack);
    if ((local_8->DebugShowGroupRects & 1U) != 0) {
      ImDrawList::AddRect((ImDrawList *)group_bb.Min,in_stack_00000038,in_stack_00000030,
                          in_stack_0000002c,in_stack_00000028,in_stack_00000024,in_stack_00000020);
    }
  }
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    // Include LastItemData.Rect.Max as a workaround for e.g. EndTable() undershooting with CursorMaxPos report. (#7543)
    ImRect group_bb(group_data.BackupCursorPos, ImMax(ImMax(window->DC.CursorMaxPos, g.LastItemData.Rect.Max), group_data.BackupCursorPos));
    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorPosPrevLine = group_data.BackupCursorPosPrevLine;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, group_bb.Max);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    window->DC.IsSameLine = group_data.BackupIsSameLine;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset); // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    if (g.DebugShowGroupRects)
        window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}